

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

word Abc_TtDeriveBiDecOne(word *pTruth,int nVars,int This)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong *puVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  word *pLimit;
  word pTemp [64];
  word Cof0 [64];
  undefined1 local_638 [512];
  ulong local_438 [64];
  ulong local_238 [65];
  
  uVar18 = Abc_TtBitCount8[This >> 8] + Abc_TtBitCount8[(ulong)(uint)This & 0xff];
  uVar5 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  uVar19 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    memcpy(local_638,pTruth,uVar19 * 8);
  }
  if (0 < nVars) {
    uVar7 = 0;
    do {
      if (((uint)This >> ((uint)uVar7 & 0x1f) & 1) != 0) goto LAB_002165dc;
      bVar10 = (byte)(1 << ((byte)uVar7 & 0x1f));
      if (uVar5 == 1) {
        local_438[0] = (s_Truths6Neg[uVar7] & local_638._0_8_) << (bVar10 & 0x3f) |
                       s_Truths6Neg[uVar7] & local_638._0_8_;
      }
      else if (uVar7 < 6) {
        if (0 < (int)uVar5) {
          uVar13 = s_Truths6Neg[uVar7];
          uVar8 = 0;
          do {
            local_438[uVar8] =
                 (local_438[uVar8 - 0x40] & uVar13) << (bVar10 & 0x3f) |
                 local_438[uVar8 - 0x40] & uVar13;
            uVar8 = uVar8 + 1;
          } while (uVar19 != uVar8);
        }
      }
      else if (0 < (int)uVar5) {
        bVar9 = (byte)(uVar7 - 6);
        uVar4 = 1 << (bVar9 & 0x1f);
        iVar11 = 2 << (bVar9 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar4) {
          uVar13 = (ulong)uVar4;
        }
        puVar17 = local_438 + (int)uVar4;
        puVar14 = (ulong *)local_638;
        puVar15 = local_438;
        do {
          if (uVar7 - 6 != 0x1f) {
            uVar8 = 0;
            do {
              uVar1 = puVar14[uVar8];
              puVar15[uVar8] = uVar1;
              puVar17[uVar8] = uVar1;
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
          }
          puVar14 = puVar14 + iVar11;
          puVar17 = puVar17 + iVar11;
          puVar15 = puVar15 + iVar11;
        } while (puVar14 < local_438 + (long)(int)uVar5 + -0x40);
      }
      if (uVar5 == 1) {
        local_238[0] = (Gia_ManFromIfLogicNode::Truth6[uVar7] & local_638._0_8_) >> (bVar10 & 0x3f)
                       | Gia_ManFromIfLogicNode::Truth6[uVar7] & local_638._0_8_;
LAB_002165ad:
        if (0 < (int)uVar5) {
          uVar13 = 0;
          do {
            local_438[uVar13 - 0x40] = local_238[uVar13] | local_438[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
        }
      }
      else if (uVar7 < 6) {
        if (0 < (int)uVar5) {
          uVar13 = Gia_ManFromIfLogicNode::Truth6[uVar7];
          uVar8 = 0;
          do {
            local_238[uVar8] =
                 (local_438[uVar8 - 0x40] & uVar13) >> (bVar10 & 0x3f) |
                 local_438[uVar8 - 0x40] & uVar13;
            uVar8 = uVar8 + 1;
          } while (uVar19 != uVar8);
          goto LAB_002165ad;
        }
      }
      else if (0 < (int)uVar5) {
        bVar10 = (byte)(uVar7 - 6);
        uVar4 = 1 << (bVar10 & 0x1f);
        iVar11 = 2 << (bVar10 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar4) {
          uVar13 = (ulong)uVar4;
        }
        puVar14 = (ulong *)local_638;
        puVar15 = local_238;
        do {
          if (uVar7 - 6 != 0x1f) {
            uVar8 = 0;
            do {
              uVar1 = puVar14[(long)(int)uVar4 + uVar8];
              puVar15[uVar8] = uVar1;
              puVar15[(long)(int)uVar4 + uVar8] = uVar1;
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
          }
          puVar14 = puVar14 + iVar11;
          puVar15 = puVar15 + iVar11;
        } while (puVar14 < local_438 + (long)(int)uVar5 + -0x40);
        goto LAB_002165ad;
      }
LAB_002165dc:
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nVars);
  }
  if (0x10 < nVars) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6df,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  if (nVars < 1) {
    uVar4 = 0;
  }
  else {
    uVar7 = 0;
    uVar4 = 0;
    do {
      if (((uint)This >> ((uint)uVar7 & 0x1f) & 1) != 0) {
        if ((int)uVar4 < (int)(uint)uVar7) {
          uVar13 = uVar7;
          do {
            uVar8 = uVar13 - 1;
            if ((long)uVar13 < 6) {
              if (0 < (int)uVar5) {
                uVar13 = s_PMasks[uVar8][0];
                uVar1 = s_PMasks[uVar8][1];
                uVar2 = s_PMasks[uVar8][2];
                uVar16 = 0;
                do {
                  uVar3 = local_438[uVar16 - 0x40];
                  bVar10 = (byte)(1 << ((byte)uVar8 & 0x1f));
                  local_438[uVar16 - 0x40] =
                       (uVar3 & uVar2) >> (bVar10 & 0x3f) |
                       (uVar3 & uVar1) << (bVar10 & 0x3f) | uVar3 & uVar13;
                  uVar16 = uVar16 + 1;
                } while (uVar19 != uVar16);
              }
            }
            else if (uVar8 == 5) {
              if (0 < (int)uVar5) {
                puVar14 = (ulong *)local_638;
                do {
                  puVar15 = (ulong *)((long)puVar14 + 4);
                  *puVar15 = *puVar15 << 0x20 | *puVar15 >> 0x20;
                  puVar14 = puVar14 + 2;
                } while (puVar14 < local_438 + (long)(int)uVar5 + -0x40);
              }
            }
            else if (0 < (int)uVar5) {
              uVar6 = 1 << ((char)uVar13 - 7U & 0x1f);
              if ((long)uVar13 < 8) {
                uVar6 = 1;
              }
              iVar11 = uVar6 * 4;
              puVar17 = local_438 + ((ulong)(uVar6 * 2) - 0x40);
              puVar15 = local_438 + ((ulong)uVar6 - 0x40);
              puVar14 = (ulong *)local_638;
              do {
                if (0 < (int)uVar6) {
                  uVar13 = 0;
                  do {
                    uVar1 = puVar15[uVar13];
                    puVar15[uVar13] = puVar17[uVar13];
                    puVar17[uVar13] = uVar1;
                    uVar13 = uVar13 + 1;
                  } while (uVar6 != uVar13);
                }
                puVar14 = puVar14 + iVar11;
                puVar17 = puVar17 + iVar11;
                puVar15 = puVar15 + iVar11;
              } while (puVar14 < local_438 + (long)(int)uVar5 + -0x40);
            }
            uVar13 = uVar8;
          } while ((long)(int)uVar4 < (long)uVar8);
        }
        uVar4 = uVar4 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nVars);
  }
  if (uVar4 != uVar18) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  if ((int)uVar18 < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x489,"word Abc_Tt6Stretch(word, int)");
  }
  uVar5 = 1;
  if (1 < uVar18) {
    uVar5 = uVar18;
  }
  uVar4 = 2;
  if (1 < uVar18) {
    uVar4 = uVar5;
  }
  uVar5 = 3;
  if (uVar4 != 2) {
    uVar5 = uVar4;
  }
  uVar6 = 4;
  if (uVar5 != 3) {
    uVar6 = uVar5;
  }
  uVar12 = 5;
  if (uVar6 != 4) {
    uVar12 = uVar6;
  }
  if (1 < uVar12 - 5) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x496,"word Abc_Tt6Stretch(word, int)");
  }
  uVar20 = ((uint)local_638._0_8_ & 1) * 3;
  if (uVar18 != 0) {
    uVar20 = (uint)local_638._0_8_;
  }
  uVar19 = (ulong)(uVar20 & 3) * 5;
  if (1 < uVar18) {
    uVar19 = local_638._0_8_;
  }
  uVar18 = (uint)uVar19 & 0xf;
  uVar7 = (ulong)(uVar18 << 4 | uVar18);
  if (uVar4 != 2) {
    uVar7 = uVar19;
  }
  uVar19 = (ulong)(uint)((int)(uVar7 & 0xff) << 8) | uVar7 & 0xff;
  if (uVar5 != 3) {
    uVar19 = uVar7;
  }
  uVar7 = (ulong)(uint)((int)uVar19 << 0x10) | uVar19 & 0xffff;
  if (uVar6 != 4) {
    uVar7 = uVar19;
  }
  uVar19 = uVar7 << 0x20 | uVar7 & 0xffffffff;
  if (uVar12 != 5) {
    uVar19 = uVar7;
  }
  return uVar19;
}

Assistant:

static inline word Abc_TtDeriveBiDecOne( word * pTruth, int nVars, int This )
{
    word pTemp[64]; 
    int nThis = Abc_TtBitCount16(This);
    int v, nWords = Abc_TtWordNum(nVars);
    Abc_TtCopy( pTemp, pTruth, nWords, 0 );
    for ( v = 0; v < nVars; v++ )
        if ( !((This >> v) & 1) )
            Abc_TtExist( pTemp, v, nWords );
    Abc_TtShrink( pTemp, nThis, nVars, This );
    return Abc_Tt6Stretch( pTemp[0], nThis );
}